

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

int check_sb_border(int mi_row,int mi_col,int row_offset,int col_offset)

{
  int col;
  int row;
  int sb_mi_size;
  int col_offset_local;
  int row_offset_local;
  int mi_col_local;
  int mi_row_local;
  undefined4 local_4;
  
  if (((((int)((mi_row & 0xfU) + row_offset) < 0) || (0xf < (int)((mi_row & 0xfU) + row_offset))) ||
      ((int)((mi_col & 0xfU) + col_offset) < 0)) || (0xf < (int)((mi_col & 0xfU) + col_offset))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int check_sb_border(const int mi_row, const int mi_col,
                           const int row_offset, const int col_offset) {
  const int sb_mi_size = mi_size_wide[BLOCK_64X64];
  const int row = mi_row & (sb_mi_size - 1);
  const int col = mi_col & (sb_mi_size - 1);

  if (row + row_offset < 0 || row + row_offset >= sb_mi_size ||
      col + col_offset < 0 || col + col_offset >= sb_mi_size)
    return 0;

  return 1;
}